

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O1

int luaV_equalobj(lua_State *L,TValue *t1,TValue *t2)

{
  uint uVar1;
  int iVar2;
  TValue *f;
  Table *pTVar3;
  uint uVar4;
  bool bVar5;
  lua_Integer i2;
  lua_Integer i1;
  GCObject *local_30;
  GCObject *local_28;
  
  uVar1 = t1->tt_;
  if ((uVar1 & 0x3f) != (t2->tt_ & 0x3fU)) {
    if ((t2->tt_ & 0xfU) != 3 || (uVar1 & 0xf) != 3) {
      return 0;
    }
    if (uVar1 == 0x13) {
      local_28 = (t1->value_).gc;
    }
    else {
      iVar2 = luaV_tointeger(t1,(lua_Integer *)&local_28,0);
      if (iVar2 == 0) {
        return 0;
      }
    }
    if (t2->tt_ == 0x13) {
      local_30 = (t2->value_).gc;
    }
    else {
      iVar2 = luaV_tointeger(t2,(lua_Integer *)&local_30,0);
      if (iVar2 == 0) {
        return 0;
      }
    }
    bVar5 = local_28 == local_30;
    goto LAB_00122a3d;
  }
  uVar4 = 1;
  switch(uVar1 & 0x3f) {
  case 0:
    goto switchD_001229ad_caseD_0;
  case 1:
    bVar5 = (t1->value_).b == (t2->value_).b;
    break;
  default:
    bVar5 = (t1->value_).gc == (t2->value_).gc;
    break;
  case 3:
    return -(uint)((t2->value_).n == (t1->value_).n) & 1;
  case 5:
    if ((GCObject *)(t1->value_).f == (t2->value_).gc) {
      return 1;
    }
    if (L == (lua_State *)0x0) {
      return 0;
    }
    pTVar3 = *(Table **)&((GCObject *)(t1->value_).f)[2].tt;
    if ((pTVar3 == (Table *)0x0) || ((pTVar3->flags & 0x20) != 0)) {
      f = (TValue *)0x0;
    }
    else {
      f = luaT_gettm(pTVar3,TM_EQ,L->l_G->tmname[5]);
    }
    if (f != (TValue *)0x0) goto LAB_00122b35;
    pTVar3 = *(Table **)((t2->value_).f + 0x28);
    goto LAB_00122b0e;
  case 7:
    if ((GCObject *)(t1->value_).f == (t2->value_).gc) {
      return 1;
    }
    if (L == (lua_State *)0x0) {
      return 0;
    }
    pTVar3 = (Table *)((GCObject *)(t1->value_).f)[1].next;
    if ((pTVar3 == (Table *)0x0) || ((pTVar3->flags & 0x20) != 0)) {
      f = (TValue *)0x0;
    }
    else {
      f = luaT_gettm(pTVar3,TM_EQ,L->l_G->tmname[5]);
    }
    if (f != (TValue *)0x0) goto LAB_00122b35;
    pTVar3 = *(Table **)((t2->value_).f + 0x10);
LAB_00122b0e:
    if ((pTVar3 == (Table *)0x0) || ((pTVar3->flags & 0x20) != 0)) {
      f = (TValue *)0x0;
    }
    else {
      f = luaT_gettm(pTVar3,TM_EQ,L->l_G->tmname[5]);
    }
LAB_00122b35:
    if (f == (TValue *)0x0) {
      return 0;
    }
    luaT_callTM(L,f,t1,t2,L->top,1);
    iVar2 = L->top->tt_;
    if (iVar2 != 0) {
      if (iVar2 != 1) {
        return 1;
      }
      return (uint)((L->top->value_).b != 0);
    }
    return 0;
  case 0x14:
    iVar2 = luaS_eqlngstr((TString *)(t1->value_).gc,(TString *)(t2->value_).gc);
    return iVar2;
  }
LAB_00122a3d:
  uVar4 = (uint)bVar5;
switchD_001229ad_caseD_0:
  return uVar4;
}

Assistant:

int luaV_equalobj (lua_State *L, const TValue *t1, const TValue *t2) {
  const TValue *tm;
  if (ttypetag(t1) != ttypetag(t2)) {  /* not the same variant? */
    if (ttype(t1) != ttype(t2) || ttype(t1) != LUA_TNUMBER)
      return 0;  /* only numbers can be equal with different variants */
    else {  /* two numbers with different variants */
      lua_Integer i1, i2;  /* compare them as integers */
      return (tointegerns(t1, &i1) && tointegerns(t2, &i2) && i1 == i2);
    }
  }
  /* values have same type and same variant */
  switch (ttypetag(t1)) {
    case LUA_VNIL: case LUA_VFALSE: case LUA_VTRUE: return 1;
    case LUA_VNUMINT: return (ivalue(t1) == ivalue(t2));
    case LUA_VNUMFLT: return luai_numeq(fltvalue(t1), fltvalue(t2));
    case LUA_VLIGHTUSERDATA: return pvalue(t1) == pvalue(t2);
    case LUA_VLCF: return fvalue(t1) == fvalue(t2);
    case LUA_VSHRSTR: return eqshrstr(tsvalue(t1), tsvalue(t2));
    case LUA_VLNGSTR: return luaS_eqlngstr(tsvalue(t1), tsvalue(t2));
    case LUA_VUSERDATA: {
      if (uvalue(t1) == uvalue(t2)) return 1;
      else if (L == NULL) return 0;
      tm = fasttm(L, uvalue(t1)->metatable, TM_EQ);
      if (tm == NULL)
        tm = fasttm(L, uvalue(t2)->metatable, TM_EQ);
      break;  /* will try TM */
    }
    case LUA_VTABLE: {
      if (hvalue(t1) == hvalue(t2)) return 1;
      else if (L == NULL) return 0;
      tm = fasttm(L, hvalue(t1)->metatable, TM_EQ);
      if (tm == NULL)
        tm = fasttm(L, hvalue(t2)->metatable, TM_EQ);
      break;  /* will try TM */
    }
    default:
      return gcvalue(t1) == gcvalue(t2);
  }
  if (tm == NULL)  /* no TM? */
    return 0;  /* objects are different */
  else {
    luaT_callTMres(L, tm, t1, t2, L->top);  /* call TM */
    return !l_isfalse(s2v(L->top));
  }
}